

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::BinaryExpression::fromSyntax
          (Compilation *compilation,BinaryExpressionSyntax *syntax,ASTContext *context)

{
  SourceRange opRange;
  SourceRange range;
  SourceRange range_00;
  SourceLocation location;
  bool bVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  long in_RDX;
  SyntaxKind *in_RSI;
  Type *in_stack_00000008;
  ASTContext *in_stack_00000010;
  ExpressionSyntax *in_stack_00000018;
  Compilation *in_stack_00000020;
  bitmask<slang::ast::ASTFlags> in_stack_00000028;
  Expression *result;
  ConstantValue val;
  BinaryOperator op;
  ExpressionSyntax *syntaxRight;
  ExpressionSyntax *syntaxLeft;
  Expression *rhs;
  Expression *lhs;
  ASTContext *in_stack_00000180;
  BinaryOperator in_stack_0000018c;
  bitmask<slang::ast::ASTFlags> flags;
  undefined1 in_stack_000001c0 [16];
  Expression *in_stack_000001f0;
  ASTContext *in_stack_000001f8;
  undefined1 in_stack_0000097f;
  ExpressionSyntax *in_stack_00000980;
  ASTContext *in_stack_00000988;
  Expression *in_stack_fffffffffffffe48;
  Compilation *in_stack_fffffffffffffe50;
  SourceLocation in_stack_fffffffffffffe58;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *__range;
  SourceLocation in_stack_fffffffffffffe60;
  Expression *this;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  Token *in_stack_fffffffffffffe70;
  SyntaxNode *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 uVar4;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
  in_stack_fffffffffffffeb8;
  bitmask<slang::ast::ASTFlags> local_108;
  bitmask<slang::ast::ASTFlags> local_100 [8];
  underlying_type local_c0;
  underlying_type local_b8;
  SourceLocation local_b0;
  SourceLocation local_a8;
  SourceLocation local_a0;
  pointer local_98;
  SourceLocation local_90;
  undefined4 local_84;
  underlying_type local_80;
  underlying_type local_78;
  bitmask<slang::ast::ASTFlags> local_70;
  BinaryOperator local_64;
  ExpressionSyntax *local_60;
  ExpressionSyntax *local_58;
  Expression *local_50;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_48;
  bitmask<slang::ast::ASTFlags> local_40;
  bitmask<slang::ast::ASTFlags> local_38;
  bitmask<slang::ast::ASTFlags> local_30;
  bitmask<slang::ast::ASTFlags> local_28;
  long local_20;
  SyntaxKind *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_28,None);
  pEVar2 = (Expression *)(local_20 + 0x10);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_30,AllowUnboundedLiteral);
  bVar1 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffe60,
                     (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffe58);
  uVar4 = false;
  if (bVar1) {
    in_stack_fffffffffffffea0 = (SyntaxNode *)(local_20 + 0x10);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_38,AllowUnboundedLiteralArithmetic);
    uVar4 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffe60,
                       (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffe58);
  }
  if ((bool)uVar4 != false) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_40,AllowUnboundedLiteral);
    local_28.m_bits = local_40.m_bits;
  }
  local_58 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                       ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa39c6a);
  local_60 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                       ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa39c83);
  local_64 = OpInfo::getBinary(*local_18);
  if ((((local_64 == Equality) || (local_64 == Inequality)) || (local_64 == CaseEquality)) ||
     (local_64 == CaseInequality)) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_70,AllowTypeReferences);
    bitmask<slang::ast::ASTFlags>::operator|=(&local_28,&local_70);
    local_48 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               Expression::tryBindInterfaceRef
                         (in_stack_00000988,in_stack_00000980,(bool)in_stack_0000097f);
    if (local_48 == (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)0x0) {
      local_78 = local_28.m_bits;
      local_48 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                 Expression::create(in_stack_00000020,in_stack_00000018,in_stack_00000010,
                                    in_stack_00000028,in_stack_00000008);
    }
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa39d71);
    bVar1 = Type::isVirtualInterface((Type *)0xa39d79);
    if (bVar1) {
      local_50 = Expression::tryBindInterfaceRef
                           (in_stack_00000988,in_stack_00000980,(bool)in_stack_0000097f);
      if (local_50 == (Expression *)0x0) {
        local_80 = local_28.m_bits;
        local_50 = Expression::create(in_stack_00000020,in_stack_00000018,in_stack_00000010,
                                      in_stack_00000028,in_stack_00000008);
      }
      else if ((*(ExpressionKind *)&(local_48->super_SyntaxListBase)._vptr_SyntaxListBase ==
                ArbitrarySymbol) && (local_50->kind == ArbitrarySymbol)) {
        local_84 = 0x360007;
        local_90 = parsing::Token::location((Token *)(local_18 + 8));
        location._4_4_ = in_stack_fffffffffffffe6c;
        location._0_4_ = in_stack_fffffffffffffe68;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffe60,
                            SUB84((ulong)in_stack_fffffffffffffe70 >> 0x20,0),location);
        local_a0 = ((SourceRange *)&(local_48->super_SyntaxListBase).childCount)->startLoc;
        local_98 = (local_48->
                   super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
                   _M_ptr;
        range.endLoc = in_stack_fffffffffffffe60;
        range.startLoc = in_stack_fffffffffffffe58;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffe50,range);
        local_b0 = (local_50->sourceRange).startLoc;
        local_a8 = (local_50->sourceRange).endLoc;
        range_00.endLoc = in_stack_fffffffffffffe60;
        range_00.startLoc = in_stack_fffffffffffffe58;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffe50,range_00);
        pEVar2 = Expression::badExpr(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        return pEVar2;
      }
    }
    else {
      local_b8 = local_28.m_bits;
      local_50 = Expression::create(in_stack_00000020,in_stack_00000018,in_stack_00000010,
                                    in_stack_00000028,in_stack_00000008);
    }
  }
  else {
    local_c0 = local_28.m_bits;
    local_48 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               Expression::create(in_stack_00000020,in_stack_00000018,in_stack_00000010,
                                  in_stack_00000028,in_stack_00000008);
    bVar1 = OpInfo::isShortCircuit(local_64);
    if (bVar1) {
      ASTContext::tryEval(in_stack_000001f8,in_stack_000001f0);
      bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa39fbd);
      if (bVar1) {
        if ((local_64 == LogicalAnd) || (local_64 != LogicalOr)) {
          bVar1 = slang::ConstantValue::isFalse((ConstantValue *)in_stack_fffffffffffffe50);
          if (bVar1) {
            bitmask<slang::ast::ASTFlags>::bitmask(local_100,UnevaluatedBranch);
            bitmask<slang::ast::ASTFlags>::operator|=(&local_28,local_100);
          }
        }
        else {
          bVar1 = slang::ConstantValue::isTrue((ConstantValue *)in_stack_fffffffffffffe50);
          if (bVar1) {
            bitmask<slang::ast::ASTFlags>::bitmask(&local_108,UnevaluatedBranch);
            bitmask<slang::ast::ASTFlags>::operator|=(&local_28,&local_108);
          }
        }
      }
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xa3a0b0);
    }
    local_50 = Expression::create(in_stack_00000020,in_stack_00000018,in_stack_00000010,
                                  in_stack_00000028,in_stack_00000008);
  }
  __range = local_48;
  this = local_50;
  parsing::Token::range(in_stack_fffffffffffffe70);
  slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffea0);
  opRange.endLoc = (SourceLocation)compilation;
  opRange.startLoc = (SourceLocation)syntax;
  pEVar3 = fromComponents((Expression *)context,(Expression *)flags.m_bits,in_stack_0000018c,opRange
                          ,(SourceRange)in_stack_000001c0,in_stack_00000180);
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             this,__range);
  ASTContext::setAttributes
            ((ASTContext *)CONCAT17(uVar4,in_stack_fffffffffffffeb0),pEVar2,
             in_stack_fffffffffffffeb8);
  return pEVar3;
}

Assistant:

Expression& BinaryExpression::fromSyntax(Compilation& compilation,
                                         const BinaryExpressionSyntax& syntax,
                                         const ASTContext& context) {
    // If we are allowed unbounded literals here, pass that along to subexpressions.
    bitmask<ASTFlags> flags = ASTFlags::None;
    if (context.flags.has(ASTFlags::AllowUnboundedLiteral) &&
        context.flags.has(ASTFlags::AllowUnboundedLiteralArithmetic)) {
        flags = ASTFlags::AllowUnboundedLiteral;
    }

    Expression *lhs, *rhs;
    auto& syntaxLeft = *syntax.left;
    auto& syntaxRight = *syntax.right;

    auto op = OpInfo::getBinary(syntax.kind);
    if (op == BinaryOperator::Equality || op == BinaryOperator::Inequality ||
        op == BinaryOperator::CaseEquality || op == BinaryOperator::CaseInequality) {
        flags |= ASTFlags::AllowTypeReferences;

        // Special case to handle comparing a virtual interface with an
        // actual instance. We can't normally bind to an instance from
        // an expression so we need to explicitly try that separately here.
        lhs = tryBindInterfaceRef(context, syntaxLeft, /* isInterfacePort */ false);
        if (!lhs)
            lhs = &create(compilation, syntaxLeft, context, flags);

        // If we found a virtual interface on the lhs we can also try for an instance
        // on the rhs. Otherwise we know we're doing normal expression binding.
        if (lhs->type->isVirtualInterface()) {
            rhs = tryBindInterfaceRef(context, syntaxRight, /* isInterfacePort */ false);
            if (!rhs) {
                rhs = &create(compilation, syntaxRight, context, flags);
            }
            else if (lhs->kind == ExpressionKind::ArbitrarySymbol &&
                     rhs->kind == ExpressionKind::ArbitrarySymbol) {
                // Having an instance on both sides is not allowed. One side must be
                // an actual virtual interface.
                context.addDiag(diag::CannotCompareTwoInstances, syntax.operatorToken.location())
                    << lhs->sourceRange << rhs->sourceRange;
                return badExpr(compilation, nullptr);
            }
        }
        else {
            rhs = &create(compilation, syntaxRight, context, flags);
        }
    }
    else {
        lhs = &create(compilation, syntaxLeft, context, flags);

        if (OpInfo::isShortCircuit(op)) {
            // We want to evaluate the lhs as a constant if possible, to know whether
            // the rhs is for sure in an unevaluated context. This is required for
            // correctness in cases where the condition on the lhs gates off otherwise
            // invalid code on the rhs.
            if (auto val = context.tryEval(*lhs)) {
                switch (op) {
                    case BinaryOperator::LogicalAnd:
                    case BinaryOperator::LogicalImplication:
                        if (val.isFalse())
                            flags |= ASTFlags::UnevaluatedBranch;
                        break;
                    case BinaryOperator::LogicalOr:
                        if (val.isTrue())
                            flags |= ASTFlags::UnevaluatedBranch;
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
        }

        rhs = &create(compilation, syntaxRight, context, flags);
    }

    auto& result = fromComponents(*lhs, *rhs, op, syntax.operatorToken.range(),
                                  syntax.sourceRange(), context);
    context.setAttributes(result, syntax.attributes);

    return result;
}